

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_bmp.c
# Opt level: O1

int bmp_read_8bit(gdImagePtr im,gdIOCtxPtr infile,bmp_info_t *info,bmp_hdr_t *header)

{
  int iVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  int index;
  int local_44;
  int local_40;
  uint local_3c;
  ulong local_38;
  
  local_44 = 0;
  iVar3 = 1;
  if ((uint)info->enctype < 2) {
    if (info->numcolors == 0) {
      info->numcolors = 0x100;
    }
    else if (0x100 < (uint)info->numcolors) {
      return 1;
    }
    iVar1 = bmp_read_palette(im,infile,info->numcolors,(uint)(info->type == 2));
    if (iVar1 == 0) {
      im->colorsTotal = info->numcolors;
      lVar2 = gdTell(infile);
      if ((lVar2 == header->off) || (iVar1 = gdSeek(infile,header->off), iVar1 != 0)) {
        iVar3 = info->width % 4;
        uVar4 = 4 - iVar3;
        if (iVar3 == 0) {
          uVar4 = 0;
        }
        local_38 = (ulong)uVar4;
        if (info->enctype == 1) {
          iVar3 = bmp_read_rle(im,infile,info);
          if (iVar3 != 0) {
            return 1;
          }
        }
        else {
          if (info->enctype != 0) {
            return 1;
          }
          iVar3 = info->height;
          if (0 < iVar3) {
            local_40 = uVar4 + 1;
            local_3c = 0;
            do {
              uVar4 = ~local_3c + iVar3;
              if (info->topdown != '\0') {
                uVar4 = local_3c;
              }
              if (0 < info->width) {
                iVar3 = 0;
                do {
                  iVar1 = gdGetByte(&local_44,infile);
                  if (iVar1 == 0) {
                    return 1;
                  }
                  if (im->open[local_44] != 0) {
                    im->open[local_44] = 0;
                  }
                  gdImageSetPixel(im,iVar3,uVar4,local_44);
                  iVar3 = iVar3 + 1;
                } while (iVar3 < info->width);
              }
              iVar3 = local_40;
              if (0 < (int)local_38) {
                do {
                  iVar1 = gdGetByte(&local_44,infile);
                  if (iVar1 == 0) {
                    return 1;
                  }
                  iVar3 = iVar3 + -1;
                } while (1 < iVar3);
              }
              local_3c = local_3c + 1;
              iVar3 = info->height;
            } while ((int)local_3c < iVar3);
          }
        }
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

static int bmp_read_8bit(gdImagePtr im, gdIOCtxPtr infile, bmp_info_t *info, bmp_hdr_t *header)
{
	int ypos = 0, xpos = 0, row = 0, index = 0;
	int padding = 0;

	if (info->enctype != BMP_BI_RGB && info->enctype != BMP_BI_RLE8) {
		return 1;
	}

	if (!info->numcolors) {
		info->numcolors = 256;
	} else if (info->numcolors < 0 || info->numcolors > 256) {
		return 1;
	}

	if (bmp_read_palette(im, infile, info->numcolors, (info->type == BMP_PALETTE_4))) {
		return 1;
	}

	im->colorsTotal = info->numcolors;

	/* There is a chance the data isn't until later, would be weird but it is possible */
	if (gdTell(infile) != header->off) {
		/* Should make sure we don't seek past the file size */
		if (!gdSeek(infile, header->off)) {
			return 1;
		}
	}

	/* The line must be divisible by 4, else its padded with NULLs */
	padding = (1 * info->width) % 4;
	if (padding) {
		padding = 4 - padding;
	}

	switch (info->enctype) {
	case BMP_BI_RGB:
		for (ypos = 0; ypos < info->height; ++ypos) {
			if (info->topdown) {
				row = ypos;
			} else {
				row = info->height - ypos - 1;
			}

			for (xpos = 0; xpos < info->width; ++xpos) {
				if (!gdGetByte(&index, infile)) {
					return 1;
				}

				if (im->open[index]) {
					im->open[index] = 0;
				}
				gdImageSetPixel(im, xpos, row, index);
			}
			/* Could create a new variable, but it isn't really worth it */
			for (xpos = padding; xpos > 0; --xpos) {
				if (!gdGetByte(&index, infile)) {
					return 1;
				}
			}
		}
		break;

	case BMP_BI_RLE8:
		if (bmp_read_rle(im, infile, info)) {
			return 1;
		}
		break;

	default:
		return 1;
	}
	return 0;
}